

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_http.hpp
# Opt level: O0

void __thiscall
SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response::
Response(Response *this,
        shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session>
        *session_,long timeout_content)

{
  _func_int *p_Var1;
  basic_streambuf<std::allocator<char>_> *this_00;
  unsigned_long maximum_size;
  element_type *this_01;
  element_type *peVar2;
  pointer this_02;
  io_context *io_context;
  undefined1 *this_03;
  allocator<char> local_21;
  long local_20;
  long timeout_content_local;
  shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session>
  *session__local;
  Response *this_local;
  
  local_20 = timeout_content;
  timeout_content_local = (long)session_;
  session__local =
       (shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session>
        *)this;
  std::ios::ios((ios *)&(this->super_ostream).field_0x68);
  std::
  enable_shared_from_this<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response>
  ::enable_shared_from_this
            ((enable_shared_from_this<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response>
              *)&(this->super_ostream).field_0x8);
  std::ostream::ostream(this,(streambuf *)&PTR_construction_vtable_24__0029efc0);
  (this->super_ostream)._vptr_basic_ostream = (_func_int **)&PTR__Response_0029ef80;
  *(undefined ***)&(this->super_ostream).field_0x68 = &PTR__Response_0029efa8;
  this_00 = (basic_streambuf<std::allocator<char>_> *)operator_new(0x60);
  maximum_size = std::numeric_limits<unsigned_long>::max();
  std::allocator<char>::allocator();
  asio::basic_streambuf<std::allocator<char>_>::basic_streambuf(this_00,maximum_size,&local_21);
  std::
  unique_ptr<asio::basic_streambuf<std::allocator<char>>,std::default_delete<asio::basic_streambuf<std::allocator<char>>>>
  ::unique_ptr<std::default_delete<asio::basic_streambuf<std::allocator<char>>>,void>
            ((unique_ptr<asio::basic_streambuf<std::allocator<char>>,std::default_delete<asio::basic_streambuf<std::allocator<char>>>>
              *)&(this->super_ostream).field_0x18,this_00);
  std::allocator<char>::~allocator(&local_21);
  this_03 = &(this->super_ostream).field_0x20;
  std::
  shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session>
  ::shared_ptr((shared_ptr<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session>
                *)this_03,session_);
  *(long *)&(this->super_ostream).field_0x30 = local_20;
  this_01 = std::
            __shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this_03);
  peVar2 = std::
           __shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this_01);
  this_02 = std::
            unique_ptr<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>,_std::default_delete<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
            ::operator->(&peVar2->socket);
  io_context = asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>::get_io_service(this_02)
  ;
  asio::io_context::strand::strand((strand *)&(this->super_ostream).field_0x38,io_context);
  std::__cxx11::
  list<std::pair<std::shared_ptr<asio::basic_streambuf<std::allocator<char>_>_>,_std::function<void_(const_std::error_code_&)>_>,_std::allocator<std::pair<std::shared_ptr<asio::basic_streambuf<std::allocator<char>_>_>,_std::function<void_(const_std::error_code_&)>_>_>_>
  ::list((list<std::pair<std::shared_ptr<asio::basic_streambuf<std::allocator<char>_>_>,_std::function<void_(const_std::error_code_&)>_>,_std::allocator<std::pair<std::shared_ptr<asio::basic_streambuf<std::allocator<char>_>_>,_std::function<void_(const_std::error_code_&)>_>_>_>
          *)&(this->super_ostream).field_0x48);
  (this->super_ostream).field_0x60 = 0;
  p_Var1 = (this->super_ostream)._vptr_basic_ostream[-3];
  std::
  unique_ptr<asio::basic_streambuf<std::allocator<char>_>,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
  ::get((unique_ptr<asio::basic_streambuf<std::allocator<char>_>,_std::default_delete<asio::basic_streambuf<std::allocator<char>_>_>_>
         *)&(this->super_ostream).field_0x18);
  std::ios::rdbuf((streambuf *)((long)&(this->super_ostream)._vptr_basic_ostream + (long)p_Var1));
  return;
}

Assistant:

Response(std::shared_ptr<Session> session_, long timeout_content) noexcept : std::ostream(nullptr), session(std::move(session_)), timeout_content(timeout_content), strand(session->connection->socket->get_io_service()) {
        rdbuf(streambuf.get());
      }